

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_type.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::set_ssl_hostname_visitor::operator()
          (set_ssl_hostname_visitor *this,ssl_stream<libtorrent::aux::utp_stream> *s)

{
  char *__s;
  stream_handle_type pSVar1;
  context_handle_type pSVar2;
  allocator<char> local_59;
  string local_58;
  host_name_verification local_38;
  ssl_stream<libtorrent::aux::utp_stream> *local_18;
  ssl_stream<libtorrent::aux::utp_stream> *s_local;
  set_ssl_hostname_visitor *this_local;
  
  __s = this->hostname_;
  local_18 = s;
  s_local = (ssl_stream<libtorrent::aux::utp_stream> *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  boost::asio::ssl::host_name_verification::host_name_verification(&local_38,&local_58);
  ssl_stream<libtorrent::aux::utp_stream>::
  set_verify_callback<boost::asio::ssl::host_name_verification>(s,&local_38,this->ec_);
  boost::asio::ssl::host_name_verification::~host_name_verification(&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  pSVar1 = ssl_stream<libtorrent::aux::utp_stream>::handle(local_18);
  this->ssl_ = pSVar1;
  pSVar2 = ssl_stream<libtorrent::aux::utp_stream>::context_handle(local_18);
  this->ctx_ = pSVar2;
  return;
}

Assistant:

void operator()(ssl_stream<T>& s)
		{
			s.set_verify_callback(ssl::host_name_verification(hostname_), *ec_);
			ssl_ = s.handle();
			ctx_ = s.context_handle();
		}